

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O2

void bufcp_put(bufc_pool *pool,buf_chunk *chunk)

{
  if (pool->spare_count < pool->spare_max) {
    chunk->r_offset = 0;
    chunk->w_offset = 0;
    chunk->next = pool->spare;
    pool->spare = chunk;
    pool->spare_count = pool->spare_count + 1;
    return;
  }
  (*Curl_cfree)(chunk);
  return;
}

Assistant:

static void bufcp_put(struct bufc_pool *pool,
                      struct buf_chunk *chunk)
{
  if(pool->spare_count >= pool->spare_max) {
    free(chunk);
  }
  else {
    chunk_reset(chunk);
    chunk->next = pool->spare;
    pool->spare = chunk;
    ++pool->spare_count;
  }
}